

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

int fmt::v7::detail::
    parse_nonnegative_int<char,fmt::v7::detail::specs_checker<fmt::v7::detail::specs_handler<fmt::v7::basic_format_parse_context<char,fmt::v7::detail::error_handler>,fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>>,char>>>&>
              (char **begin,char *end,
              specs_checker<fmt::v7::detail::specs_handler<fmt::v7::basic_format_parse_context<char,_fmt::v7::detail::error_handler>,_fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>_>_>
              *eh)

{
  byte *pbVar1;
  byte bVar2;
  uint uVar3;
  
  pbVar1 = (byte *)*begin;
  if ((pbVar1 == (byte *)end) || (bVar2 = *pbVar1, 9 < (byte)(bVar2 - 0x30))) {
    assert_fail("/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/src/include/fmt/format.h"
                ,0x92f,"");
  }
  uVar3 = 0;
  do {
    pbVar1 = pbVar1 + 1;
    if (0xccccccc < uVar3) {
      uVar3 = 0x80000000;
      goto LAB_0021cfad;
    }
    uVar3 = (uVar3 * 10 + (uint)bVar2) - 0x30;
    *begin = (char *)pbVar1;
  } while ((pbVar1 != (byte *)end) && (bVar2 = *pbVar1, (byte)(bVar2 - 0x30) < 10));
  if ((int)uVar3 < 0) {
LAB_0021cfad:
    specs_handler<fmt::v7::basic_format_parse_context<char,_fmt::v7::detail::error_handler>,_fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>_>
    ::on_error(&eh->
                super_specs_handler<fmt::v7::basic_format_parse_context<char,_fmt::v7::detail::error_handler>,_fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>_>
               ,"number is too big");
  }
  return uVar3;
}

Assistant:

FMT_CONSTEXPR int parse_nonnegative_int(const Char*& begin, const Char* end,
                                        ErrorHandler&& eh) {
  FMT_ASSERT(begin != end && '0' <= *begin && *begin <= '9', "");
  unsigned value = 0;
  // Convert to unsigned to prevent a warning.
  constexpr unsigned max_int = max_value<int>();
  unsigned big = max_int / 10;
  do {
    // Check for overflow.
    if (value > big) {
      value = max_int + 1;
      break;
    }
    value = value * 10 + unsigned(*begin - '0');
    ++begin;
  } while (begin != end && '0' <= *begin && *begin <= '9');
  if (value > max_int) eh.on_error("number is too big");
  return static_cast<int>(value);
}